

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1c0a25::MkdirCommand::executeExternalCommand
          (MkdirCommand *this,BuildSystem *system,TaskInterface ti,QueueJobContext *context,
          Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *completionFn)

{
  BuildNode *pBVar1;
  pointer pcVar2;
  _func_int *p_Var3;
  char cVar4;
  BuildEngineDelegate *pBVar5;
  long *plVar6;
  long *plVar7;
  ulong *puVar8;
  TaskInterface local_a8;
  ulong local_98;
  long lStack_90;
  undefined8 local_88;
  Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *local_80;
  MkdirCommand *local_78;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  pBVar1 = *(this->super_ExternalCommand).super_Command.outputs.
            super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  plVar6 = *(long **)((long)system->impl + 0x10);
  pcVar2 = (pBVar1->super_Node).name._M_dataplus._M_p;
  local_a8.impl = &local_98;
  local_80 = completionFn;
  local_78 = this;
  if (pcVar2 == (pointer)0x0) {
    local_a8.ctx = (void *)0x0;
    local_98 = local_98 & 0xffffffffffffff00;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,pcVar2,pcVar2 + (pBVar1->super_Node).name._M_string_length);
  }
  cVar4 = (**(code **)(*plVar6 + 0x18))(plVar6,&local_a8);
  if ((ulong *)local_a8.impl != &local_98) {
    operator_delete(local_a8.impl,local_98 + 1);
  }
  if (cVar4 == '\0') {
    local_a8.impl = ti.impl;
    local_a8.ctx = ti.ctx;
    pBVar5 = llbuild::core::TaskInterface::delegate(&local_a8);
    p_Var3 = pBVar5[1]._vptr_BuildEngineDelegate[1];
    pcVar2 = (pBVar1->super_Node).name._M_dataplus._M_p;
    local_70 = &local_60;
    if (pcVar2 == (pointer)0x0) {
      local_68 = 0;
      local_60 = 0;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,pcVar2,pcVar2 + (pBVar1->super_Node).name._M_string_length);
    }
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x1f9269);
    plVar7 = plVar6 + 2;
    if ((long *)*plVar6 == plVar7) {
      local_40 = *plVar7;
      lStack_38 = plVar6[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *plVar7;
      local_50 = (long *)*plVar6;
    }
    local_48 = plVar6[1];
    *plVar6 = (long)plVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
    puVar8 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar8) {
      local_98 = *puVar8;
      lStack_90 = plVar6[3];
      local_a8.impl = &local_98;
    }
    else {
      local_98 = *puVar8;
      local_a8.impl = (ulong *)*plVar6;
    }
    local_a8.ctx = (void *)plVar6[1];
    *plVar6 = (long)puVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    (**(code **)(*(long *)p_Var3 + 0x58))(p_Var3,local_78,local_a8.impl);
    if ((ulong *)local_a8.impl != &local_98) {
      operator_delete(local_a8.impl,local_98 + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,local_40 + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
    }
    if ((local_80->Storage).hasVal != true) {
      return;
    }
    local_a8.impl = (void *)0xffffffff00000001;
  }
  else {
    if ((local_80->Storage).hasVal != true) {
      return;
    }
    local_a8.impl = (void *)0xffffffff00000000;
  }
  local_a8.ctx = (void *)CONCAT44(local_a8.ctx._4_4_,0xffffffff);
  local_98 = 0;
  lStack_90 = 0;
  local_88 = 0;
  if (*(long *)((local_80->Storage).storage.super_AlignedCharArray<8UL,_32UL>.buffer + 0x10) != 0) {
    (**(code **)((local_80->Storage).storage.super_AlignedCharArray<8UL,_32UL>.buffer + 0x18))
              (local_80,&local_a8);
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

virtual void executeExternalCommand(
      BuildSystem& system,
      TaskInterface ti,
      QueueJobContext* context,
      llvm::Optional<ProcessCompletionFn> completionFn) override {
    auto output = getOutputs()[0];
    if (!system.getFileSystem().createDirectories(
            output->getName())) {
      getBuildSystem(ti).getDelegate().commandHadError(this,
                     "unable to create directory '" + output->getName().str() + "'");
      if (completionFn.hasValue())
        completionFn.getValue()(ProcessStatus::Failed);
      return;
    }
    if (completionFn.hasValue())
      completionFn.getValue()(ProcessStatus::Succeeded);
  }